

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall
QByteArray::replace(QByteArray *this,QByteArrayView before,QByteArrayView after)

{
  qsizetype qVar1;
  char *pcVar2;
  long lVar3;
  qsizetype qVar4;
  size_t sVar5;
  size_t __n;
  _Alloc_hider __first;
  long lVar6;
  long lVar7;
  size_t __n_00;
  _Alloc_hider __first_00;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  long in_FS_OFFSET;
  bool bVar17;
  size_t local_84d8;
  size_t local_84b8;
  size_t indices [4096];
  QByteArrayMatcher matcher;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  __first_00._M_p = after.m_data;
  __n = after.m_size;
  __first._M_p = before.m_data;
  __n_00 = before.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->d).size;
  if (lVar3 == 0) {
    if (__n_00 != 0) goto LAB_00147127;
  }
  else if (__n == __n_00 && __first._M_p == __first_00._M_p) goto LAB_00147127;
  if (__n != 0 || __n_00 != 0) {
    if (__n == 1 && __n_00 == 1) {
      replace(this,*__first._M_p,*__first_00._M_p);
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._M_string_length = 0;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0xaaaaaaaaaaaaaa00;
      local_78.field_2._M_allocated_capacity = 0xaaaaaaaaaaaaaa00;
      pcVar2 = (this->d).ptr;
      if (__first_00._M_p < pcVar2 + lVar3 && pcVar2 <= __first_00._M_p) {
        std::__cxx11::string::assign<char_const*,void>
                  ((string *)&local_78,__first_00._M_p,__first_00._M_p + __n);
        pcVar2 = (this->d).ptr;
        lVar3 = (this->d).size;
        __first_00._M_p = local_78._M_dataplus._M_p;
      }
      if ((pcVar2 <= __first._M_p) && (__first._M_p < pcVar2 + lVar3)) {
        std::__cxx11::string::assign<char_const*,void>
                  ((string *)&local_58,__first._M_p,__first._M_p + __n_00);
        __first._M_p = local_58._M_dataplus._M_p;
      }
      memset(&matcher,0xaa,0x420);
      QByteArrayMatcher::QByteArrayMatcher(&matcher,__first._M_p,__n_00);
      sVar9 = (this->d).size;
      pcVar2 = data(this);
      lVar3 = __n - __n_00;
      if (lVar3 == 0) {
        if (__n_00 != 0) {
          qVar4 = 0;
          while (qVar4 = QByteArrayMatcher::indexIn<void>(&matcher,this,qVar4), qVar4 != -1) {
            memcpy(pcVar2 + qVar4,__first_00._M_p,__n_00);
            qVar4 = qVar4 + __n_00;
          }
        }
      }
      else if ((long)__n < (long)__n_00) {
        lVar15 = 0;
        lVar12 = 0;
        lVar7 = 0;
        local_84d8 = sVar9;
        while (qVar4 = QByteArrayMatcher::indexIn<void>(&matcher,this,lVar7), qVar4 != -1) {
          bVar17 = lVar15 != 0;
          lVar15 = lVar15 + -1;
          qVar1 = qVar4;
          if ((bVar17) && (sVar11 = qVar4 - lVar7, qVar1 = lVar12, 0 < (long)sVar11)) {
            memmove(pcVar2 + lVar12,pcVar2 + lVar7,sVar11);
            qVar1 = sVar11 + lVar12;
          }
          lVar12 = qVar1;
          if (0 < (long)__n) {
            memcpy(pcVar2 + lVar12,__first_00._M_p,__n);
            lVar12 = lVar12 + __n;
          }
          lVar7 = qVar4 + __n_00;
          local_84d8 = local_84d8 + lVar3;
        }
        if (lVar15 != 0) {
          if (0 < (long)(sVar9 - lVar7)) {
            memmove(pcVar2 + lVar12,pcVar2 + lVar7,sVar9 - lVar7);
          }
          resize(this,local_84d8);
        }
      }
      else {
        lVar12 = lVar3 * 0xfff;
        lVar15 = __n_00 - __n;
        lVar7 = 0;
        while (lVar7 != -1) {
          memset(indices,0xaa,0x8000);
          lVar16 = -1;
          lVar10 = 0;
          sVar11 = __n_00;
          lVar13 = lVar15;
          for (lVar6 = 0; lVar6 != 0xfff; lVar6 = lVar6 + 1) {
            sVar5 = QByteArrayMatcher::indexIn<void>(&matcher,this,lVar7);
            if (sVar5 == 0xffffffffffffffff) {
              lVar7 = -1;
              if (lVar6 == 0) goto LAB_00147100;
              goto LAB_00147038;
            }
            indices[lVar6] = sVar5;
            lVar7 = sVar5 + __n_00 + (__n_00 == 0);
            lVar10 = lVar10 + lVar3;
            lVar13 = lVar13 + lVar3;
            sVar11 = sVar11 + lVar3;
            lVar16 = lVar16 + 1;
          }
          lVar10 = lVar12;
          if (lVar7 != -1) {
            lVar7 = lVar7 + lVar12;
          }
LAB_00147038:
          local_84b8 = sVar9;
          if (0 < lVar10) {
            local_84b8 = lVar10 + sVar9;
            resize(this,local_84b8);
          }
          pcVar2 = (this->d).ptr;
          pcVar14 = pcVar2 + lVar13;
          pcVar8 = pcVar2 + sVar11;
          sVar5 = sVar9;
          for (; sVar9 = local_84b8, lVar16 != -1; lVar16 = lVar16 + -1) {
            sVar9 = indices[lVar16];
            memmove(pcVar8 + sVar9,pcVar2 + __n_00 + sVar9,sVar5 - (__n_00 + sVar9));
            if (__n != 0) {
              memcpy(pcVar14 + sVar9,__first_00._M_p,__n);
            }
            pcVar14 = pcVar14 + lVar15;
            pcVar8 = pcVar8 + lVar15;
            sVar5 = sVar9;
          }
        }
      }
LAB_00147100:
      QByteArrayMatcher::~QByteArrayMatcher(&matcher);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
                (&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
                (&local_58);
    }
  }
LAB_00147127:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QByteArray &QByteArray::replace(QByteArrayView before, QByteArrayView after)
{
    const char *b = before.data();
    qsizetype bsize = before.size();
    const char *a = after.data();
    qsizetype asize = after.size();

    if (isEmpty()) {
        if (bsize)
            return *this;
    } else {
        if (b == a && bsize == asize)
            return *this;
    }
    if (asize == 0 && bsize == 0)
        return *this;

    if (bsize == 1 && asize == 1)
        return replace(*b, *a); // use the fast char-char algorithm

    // protect against before or after being part of this
    std::string pinnedNeedle, pinnedReplacement;
    if (QtPrivate::q_points_into_range(a, d)) {
        pinnedReplacement.assign(a, a + asize);
        a = pinnedReplacement.data();
    }
    if (QtPrivate::q_points_into_range(b, d)) {
        pinnedNeedle.assign(b, b + bsize);
        b = pinnedNeedle.data();
    }

    QByteArrayMatcher matcher(b, bsize);
    qsizetype index = 0;
    qsizetype len = size();
    char *d = data(); // detaches

    if (bsize == asize) {
        if (bsize) {
            while ((index = matcher.indexIn(*this, index)) != -1) {
                memcpy(d + index, a, asize);
                index += bsize;
            }
        }
    } else if (asize < bsize) {
        size_t to = 0;
        size_t movestart = 0;
        size_t num = 0;
        while ((index = matcher.indexIn(*this, index)) != -1) {
            if (num) {
                qsizetype msize = index - movestart;
                if (msize > 0) {
                    memmove(d + to, d + movestart, msize);
                    to += msize;
                }
            } else {
                to = index;
            }
            if (asize > 0) {
                memcpy(d + to, a, asize);
                to += asize;
            }
            index += bsize;
            movestart = index;
            num++;
        }
        if (num) {
            qsizetype msize = len - movestart;
            if (msize > 0)
                memmove(d + to, d + movestart, msize);
            resize(len - num*(bsize-asize));
        }
    } else {
        // the most complex case. We don't want to lose performance by doing repeated
        // copies and reallocs of the data.
        while (index != -1) {
            size_t indices[4096];
            size_t pos = 0;
            while(pos < 4095) {
                index = matcher.indexIn(*this, index);
                if (index == -1)
                    break;
                indices[pos++] = index;
                index += bsize;
                // avoid infinite loop
                if (!bsize)
                    index++;
            }
            if (!pos)
                break;

            // we have a table of replacement positions, use them for fast replacing
            qsizetype adjust = pos*(asize-bsize);
            // index has to be adjusted in case we get back into the loop above.
            if (index != -1)
                index += adjust;
            qsizetype newlen = len + adjust;
            qsizetype moveend = len;
            if (newlen > len) {
                resize(newlen);
                len = newlen;
            }
            d = this->d.data(); // data(), without the detach() check

            while(pos) {
                pos--;
                qsizetype movestart = indices[pos] + bsize;
                qsizetype insertstart = indices[pos] + pos*(asize-bsize);
                qsizetype moveto = insertstart + asize;
                memmove(d + moveto, d + movestart, (moveend - movestart));
                if (asize)
                    memcpy(d + insertstart, a, asize);
                moveend = movestart - bsize;
            }
        }
    }
    return *this;
}